

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O0

lineiter_t * lineiter_start(FILE *fh)

{
  char *pcVar1;
  int iVar2;
  lineiter_t *plVar3;
  char *pcVar4;
  size_t __n;
  lineiter_t *li;
  FILE *fh_local;
  
  plVar3 = (lineiter_t *)
           __ckd_calloc__(1,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                          ,0x10d);
  pcVar4 = (char *)__ckd_malloc__(0x80,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/util/pio.c"
                                  ,0x10e);
  plVar3->buf = pcVar4;
  *plVar3->buf = '\0';
  plVar3->bsiz = 0x80;
  plVar3->len = 0;
  plVar3->fh = fh;
  plVar3 = lineiter_next(plVar3);
  if (plVar3 != (lineiter_t *)0x0) {
    iVar2 = strncmp(plVar3->buf,anon_var_dwarf_156e3,3);
    if (iVar2 == 0) {
      pcVar4 = plVar3->buf;
      pcVar1 = plVar3->buf;
      __n = strlen(plVar3->buf + 1);
      memmove(pcVar4,pcVar1 + 3,__n);
      plVar3->len = plVar3->len + -3;
    }
  }
  return plVar3;
}

Assistant:

lineiter_t *
lineiter_start(FILE *fh)
{
    lineiter_t *li;

    li = (lineiter_t *)ckd_calloc(1, sizeof(*li));
    li->buf = (char *)ckd_malloc(128);
    li->buf[0] = '\0';
    li->bsiz = 128;
    li->len = 0;
    li->fh = fh;

    li = lineiter_next(li);
    
    /* Strip the UTF-8 BOM */
    
    if (li && 0 == strncmp(li->buf, "\xef\xbb\xbf", 3)) {
	memmove(li->buf, li->buf + 3, strlen(li->buf + 1));
	li->len -= 3;
    }
    
    return li;
}